

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O0

MatrixXd * __thiscall
Tools::CalculateJacobian(MatrixXd *__return_storage_ptr__,Tools *this,VectorXd *x_state)

{
  CoeffReturnType pdVar1;
  invalid_argument *this_00;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar2;
  float fVar3;
  double dVar4;
  __type _Var5;
  float fVar6;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  Scalar local_c0;
  Scalar local_b8;
  double local_b0;
  double local_a8;
  Scalar local_a0;
  Scalar local_98;
  double local_90;
  double local_88;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_80;
  float local_5c;
  float local_58;
  float bigOne;
  float px2Ppy2Sq;
  float px2Ppy2;
  float py2;
  float px2;
  float vy;
  float vx;
  float py;
  float local_30;
  int local_2c;
  float px;
  undefined1 local_21;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *local_20;
  VectorXd *x_state_local;
  Tools *this_local;
  MatrixXd *Hj;
  
  local_21 = 0;
  px = 4.2039e-45;
  local_2c = 4;
  local_20 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x_state;
  x_state_local = (VectorXd *)this;
  this_local = (Tools *)__return_storage_ptr__;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,(int *)&px,&local_2c);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()(local_20,0)
  ;
  local_30 = (float)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()(local_20,1)
  ;
  vy = (float)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()(local_20,2)
  ;
  px2 = (float)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()(local_20,3)
  ;
  py2 = (float)*pdVar1;
  if (((local_30 != 0.0) || (NAN(local_30))) && ((vy != 0.0 || (NAN(vy))))) {
    px2Ppy2 = local_30 * local_30;
    px2Ppy2Sq = vy * vy;
    bigOne = px2Ppy2 + px2Ppy2Sq;
    dVar4 = std::sqrt((double)(ulong)(uint)bigOne);
    local_58 = SUB84(dVar4,0);
    fVar6 = py2 * local_30;
    fVar3 = px2 * vy;
    _Var5 = std::pow<float,int>(bigOne,1);
    local_5c = (float)((double)(fVar3 - fVar6) / _Var5);
    local_88 = (double)(local_30 / local_58);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
              (&local_80,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,
               &local_88);
    local_90 = (double)(vy / local_58);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_80,&local_90);
    local_98 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_98);
    local_a0 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_a0);
    local_a8 = (double)(-vy / bigOne);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_a8);
    local_b0 = (double)(local_30 / bigOne);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_b0);
    local_b8 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_b8);
    local_c0 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_c0);
    local_c8 = (double)(vy * local_5c);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_c8);
    local_d0 = (double)(local_30 * local_5c);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_d0);
    local_d8 = (double)(local_30 / local_58);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_d8);
    local_e0 = (double)(vy / local_58);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar2,&local_e0);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_80)
    ;
    return __return_storage_ptr__;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Division by zero error calculation jacobian");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

MatrixXd Tools::CalculateJacobian(const VectorXd& x_state) {
    MatrixXd Hj(3,4);
    //recover state parameters
    float px = x_state(0);
    float py = x_state(1);
    float vx = x_state(2);
    float vy = x_state(3);

    //check division by zero
    if(px == 0 || py == 0) {
        throw std::invalid_argument("Division by zero error calculation jacobian");
    }

    //compute the Jacobian matrix
    float px2 = px * px;
    float py2 = py * py;
    float px2Ppy2 = px2 + py2;
    float px2Ppy2Sq = sqrt(px2Ppy2);
    float bigOne = (vx*py - vy*px)/(pow(px2Ppy2, 3/2));

    Hj << px/px2Ppy2Sq, py/px2Ppy2Sq, 0, 0,
            -py/px2Ppy2, px/px2Ppy2, 0, 0,
            py*bigOne, px*bigOne, px/px2Ppy2Sq, py/px2Ppy2Sq;

    return Hj;
}